

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDataServerCommand.cpp
# Opt level: O1

void * OpenDataServerCommand::readFromServer(int *soket)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  DataBase *pDVar4;
  ssize_t sVar5;
  DataBase *pDVar6;
  char cVar7;
  undefined1 local_478 [8];
  char buffer [1024];
  size_type *local_70;
  string sim_line;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  bVar1 = DataBase::getIsRunning(data);
  if (bVar1) {
    do {
      pDVar4 = DataBase::getInstance();
      if (pDVar4 == (DataBase *)0x0) {
        return (void *)0x0;
      }
      memset(local_478,0,0x400);
      sVar5 = read(*soket,local_478,0x400);
      local_70 = &sim_line._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,local_478,local_478 + (int)sVar5);
      cVar7 = (char)(string *)&local_70;
      iVar2 = std::__cxx11::string::find(cVar7,10);
      iVar3 = std::__cxx11::string::rfind(cVar7,10);
      if ((((iVar2 != -1) && (iVar3 != -1)) &&
          (iVar2 = pthread_mutex_trylock((pthread_mutex_t *)&data->sim_var_map_lock), iVar2 == 0))
         && ((iVar2 = pthread_mutex_trylock((pthread_mutex_t *)&data->in_var_map_lock), iVar2 == 0
             && (pDVar6 = DataBase::getInstance(), pDVar4 = data, pDVar6 != (DataBase *)0x0)))) {
        sim_line.field_2._8_8_ = &local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&sim_line.field_2 + 8),local_70,
                   sim_line._M_dataplus._M_p + (long)local_70);
        DataBase::setSimData(pDVar4,(string *)((long)&sim_line.field_2 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sim_line.field_2._8_8_ != &local_40) {
          operator_delete((void *)sim_line.field_2._8_8_,local_40._M_allocated_capacity + 1);
        }
      }
      if (local_70 != &sim_line._M_string_length) {
        operator_delete(local_70,sim_line._M_string_length + 1);
      }
      bVar1 = DataBase::getIsRunning(data);
    } while (bVar1);
  }
  return (void *)0x0;
}

Assistant:

void *OpenDataServerCommand::readFromServer(int *soket) {
  //reading from client
  while (data->getIsRunning() && data->getInstance() != nullptr) {
    char buffer[1024] = {0};
    int valread = read(*soket, buffer, 1024);
    string sim_line(buffer, valread);
    // making sure it has 36 values between /n
    int has_n = sim_line.find_first_of('\n');
    int has_n2 = sim_line.find_last_of('\n');
    if (has_n != -1 && has_n2 != -1) {
      if (data->sim_var_map_lock.try_lock() && data->in_var_map_lock.try_lock()
          && data->getInstance() != nullptr) {
        data->setSimData(sim_line);
      }
    }
  }
  return nullptr;
}